

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

size_t write_vars(MIR_context_t ctx,writer_func_t writer,MIR_func_t func,VARR_MIR_var_t *vars,
                 size_t start,size_t vars_num,char *prefix)

{
  size_t *psVar1;
  MIR_type_t t;
  uint uVar2;
  MIR_var_t *pMVar3;
  reduce_data *prVar4;
  ulong u;
  bool bVar5;
  uint32_t uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  reg_desc_t *prVar10;
  ulong uVar11;
  uint8_t *puVar12;
  long extraout_RDX;
  long lVar13;
  uint8_t uVar14;
  MIR_context_t unaff_RBP;
  char *pcVar15;
  MIR_context_t ctx_00;
  ulong uVar16;
  ulong uVar17;
  MIR_str_t str;
  MIR_str_t str_00;
  MIR_str_t str_01;
  long local_48;
  MIR_func_t func_00;
  
  if (vars == (VARR_MIR_var_t *)0x0 || vars_num == 0) {
    sVar7 = 0;
  }
  else {
    local_48 = 0;
    lVar13 = start * 0x18 + 8;
    bVar5 = false;
    do {
      pMVar3 = vars->varr;
      if ((pMVar3 == (MIR_var_t *)0x0) || (vars->els_num <= start)) {
        write_vars_cold_1();
LAB_00143b94:
        pcVar15 = "undeclared func reg %s";
        ctx_00 = (MIR_context_t)0xf;
        (*ctx->error_func)(MIR_undeclared_func_reg_error,"undeclared func reg %s",unaff_RBP);
        if ((writer_func_t)pcVar15 == (writer_func_t)0x0) {
          sVar7 = 0;
        }
        else {
          u = *(ulong *)(extraout_RDX + 0x30);
          if (u < 0x80) {
            lVar13 = 0;
          }
          else {
            uVar11 = u;
            uVar17 = 0xffffffffffffffff;
            do {
              uVar16 = uVar17;
              uVar17 = uVar16 + 1;
              bVar5 = 0xff < uVar11;
              uVar11 = uVar11 >> 8;
            } while (bVar5);
            if (3 < uVar17) {
              __assert_fail("nb <= 4",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                            ,0x12db,"size_t write_lab(MIR_context_t, writer_func_t, MIR_label_t)");
            }
            lVar13 = uVar16 + 2;
          }
          lVar13 = lVar13 + (ulong)(lVar13 == 0);
          uVar14 = (char)lVar13 + '\x1f';
          prVar4 = ctx_00->io_ctx->io_reduce_data;
          uVar2 = prVar4->buf_bound;
          if ((ulong)uVar2 < 0x40000) {
            uVar6 = uVar2 + 1;
            prVar4->buf[uVar2] = uVar14;
          }
          else {
            _reduce_encode_buf(prVar4);
            uVar6 = 1;
            prVar4->buf[0] = uVar14;
          }
          prVar4->buf_bound = uVar6;
          sVar7 = put_uint(ctx_00,(writer_func_t)pcVar15,u,(int)lVar13);
          sVar7 = sVar7 + 1;
          psVar1 = &ctx_00->io_ctx->output_labs_len;
          *psVar1 = *psVar1 + sVar7;
        }
        return sVar7;
      }
      t = *(MIR_type_t *)((long)pMVar3 + lVar13 + -8);
      unaff_RBP = *(MIR_context_t *)((long)&pMVar3->type + lVar13);
      if (!bVar5) {
        sVar8 = strlen(prefix);
        str.s = prefix;
        str.len = sVar8 + 1;
        sVar7 = write_str_tag(ctx,writer,str,TAG_NAME1);
        local_48 = local_48 + sVar7;
      }
      sVar7 = write_type(ctx,writer,t);
      sVar8 = strlen((char *)unaff_RBP);
      str_00.s = (char *)unaff_RBP;
      str_00.len = sVar8 + 1;
      sVar9 = write_str_tag(ctx,writer,str_00,TAG_NAME1);
      prVar10 = find_rd_by_name(unaff_RBP,(char *)func->internal,func_00);
      if (prVar10 == (reg_desc_t *)0x0) goto LAB_00143b94;
      local_48 = local_48 + sVar7 + sVar9;
      prVar10 = find_rd_by_reg(ctx,prVar10->reg,func);
      pcVar15 = prVar10->hard_reg_name;
      if (pcVar15 != (char *)0x0) {
        sVar8 = strlen(pcVar15);
        str_01.s = pcVar15;
        str_01.len = sVar8 + 1;
        sVar7 = write_str_tag(ctx,writer,str_01,TAG_NAME1);
        local_48 = local_48 + sVar7;
      }
      lVar13 = lVar13 + 0x18;
      bVar5 = true;
      start = start + 1;
      vars_num = vars_num - 1;
    } while (vars_num != 0);
    if (writer == (writer_func_t)0x0) {
      lVar13 = 0;
    }
    else {
      prVar4 = ctx->io_ctx->io_reduce_data;
      uVar2 = prVar4->buf_bound;
      if ((ulong)uVar2 < 0x40000) {
        uVar6 = uVar2 + 1;
        puVar12 = prVar4->buf + uVar2;
      }
      else {
        _reduce_encode_buf(prVar4);
        puVar12 = prVar4->buf;
        uVar6 = 1;
      }
      *puVar12 = '=';
      prVar4->buf_bound = uVar6;
      lVar13 = 1;
    }
    sVar7 = lVar13 + local_48;
  }
  return sVar7;
}

Assistant:

static size_t write_vars (MIR_context_t ctx, writer_func_t writer, MIR_func_t func,
                          VARR (MIR_var_t) * vars, size_t start, size_t vars_num,
                          const char *prefix) {
  if (vars_num == 0 || vars == NULL) return 0;
  size_t len = 0;
  int first_p = TRUE;
  for (size_t i = 0; i < vars_num; i++) {
    MIR_var_t var = VARR_GET (MIR_var_t, vars, i + start);
    if (first_p) len += write_name (ctx, writer, prefix);
    first_p = FALSE;
    len += write_type (ctx, writer, var.type);
    len += write_name (ctx, writer, var.name);
    MIR_reg_t reg = MIR_reg (ctx, var.name, func);
    const char *hard_reg_name = MIR_reg_hard_reg_name (ctx, reg, func);
    if (hard_reg_name != NULL) len += write_name (ctx, writer, hard_reg_name);
  }
  len += put_byte (ctx, writer, TAG_EOI);
  return len;
}